

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::HasExtraArrayness
          (InterfaceVariableScalarReplacement *this,Instruction *entry_point,Instruction *var)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t id;
  StorageClass SVar3;
  DecorationManager *this_00;
  
  bVar1 = false;
  uVar2 = Instruction::GetSingleWordInOperand(entry_point,0);
  if (0xfffffffd < uVar2 - 3) {
    this_00 = IRContext::get_decoration_mgr((this->super_Pass).context_);
    id = Instruction::result_id(var);
    bVar1 = analysis::DecorationManager::HasDecoration(this_00,id,0xf);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (uVar2 != 1) {
        SVar3 = anon_unknown_0::GetStorageClass(var);
        bVar1 = SVar3 != Output;
      }
    }
  }
  return bVar1;
}

Assistant:

bool InterfaceVariableScalarReplacement::HasExtraArrayness(
    Instruction& entry_point, Instruction* var) {
  spv::ExecutionModel execution_model =
      static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
  if (execution_model != spv::ExecutionModel::TessellationEvaluation &&
      execution_model != spv::ExecutionModel::TessellationControl) {
    return false;
  }
  if (!context()->get_decoration_mgr()->HasDecoration(
          var->result_id(), uint32_t(spv::Decoration::Patch))) {
    if (execution_model == spv::ExecutionModel::TessellationControl)
      return true;
    return GetStorageClass(var) != spv::StorageClass::Output;
  }
  return false;
}